

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_array_add_mod_ref(lysc_ctx *ctx,lys_module *mod,lys_module ***mod_array)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  long *plVar3;
  lys_module *plVar4;
  long lVar5;
  
  pplVar1 = *mod_array;
  if (pplVar1 == (lys_module **)0x0) {
    plVar3 = (long *)malloc(0x10);
    if (plVar3 == (long *)0x0) goto LAB_001530b9;
    *plVar3 = 1;
    lVar5 = 1;
  }
  else {
    plVar2 = pplVar1[-1];
    if (plVar2 != (lys_module *)0x0) {
      plVar4 = (lys_module *)0x0;
      do {
        if (pplVar1[(long)plVar4] == mod) {
          return LY_EEXIST;
        }
        plVar4 = (lys_module *)((long)&plVar4->ctx + 1);
      } while (plVar2 != plVar4);
    }
    pplVar1[-1] = (lys_module *)((long)&plVar2->ctx + 1);
    plVar3 = (long *)realloc(pplVar1 + -1,(long)plVar2 * 8 + 0x10);
    if (plVar3 == (long *)0x0) {
      (*mod_array)[-1] = (lys_module *)&(*mod_array)[-1][-1].field_0x7f;
LAB_001530b9:
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_array_add_mod_ref");
      return LY_EMEM;
    }
    lVar5 = *plVar3;
  }
  *mod_array = (lys_module **)(plVar3 + 1);
  plVar3[lVar5] = (long)mod;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_array_add_mod_ref(struct lysc_ctx *ctx, struct lys_module *mod, struct lys_module ***mod_array)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module **new_mod;

    LY_ARRAY_FOR(*mod_array, u) {
        if ((*mod_array)[u] == mod) {
            /* already there */
            return LY_EEXIST;
        }
    }

    /* add the new module ref */
    LY_ARRAY_NEW_RET(ctx->ctx, *mod_array, new_mod, LY_EMEM);
    *new_mod = mod;

    return LY_SUCCESS;
}